

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::GetColumnWidth(int column_index)

{
  float fVar1;
  ImGuiColumns *columns_00;
  ImGuiColumnData *pIVar2;
  ImVec2 IVar3;
  float local_30;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  int column_index_local;
  
  columns_00 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (columns_00 == (ImGuiColumns *)0x0) {
    IVar3 = GetContentRegionAvail();
    local_30 = IVar3.x;
    g._4_4_ = local_30;
  }
  else {
    g._0_4_ = column_index;
    if (column_index < 0) {
      g._0_4_ = columns_00->Current;
    }
    pIVar2 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,(int)g + 1);
    fVar1 = pIVar2->OffsetNorm;
    pIVar2 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,(int)g);
    g._4_4_ = GetColumnOffsetFromNorm(columns_00,fVar1 - pIVar2->OffsetNorm);
  }
  return g._4_4_;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return GetContentRegionAvail().x;

    if (column_index < 0)
        column_index = columns->Current;
    return GetColumnOffsetFromNorm(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}